

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O3

void andnot_test(void)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  bitset_container_t *src_1;
  bitset_container_t *src_2;
  bitset_container_t *bitset;
  bitset_container_t *dst;
  int index;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  src_1 = bitset_container_create();
  src_2 = bitset_container_create();
  bitset = bitset_container_create();
  dst = bitset_container_create();
  _assert_true((unsigned_long)src_1,"B1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xec);
  _assert_true((unsigned_long)src_2,"B2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xed);
  _assert_true((unsigned_long)bitset,"BI",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xee);
  _assert_true((unsigned_long)dst,"TMP",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xef);
  puVar1 = src_1->words;
  puVar2 = bitset->words;
  uVar7 = 0xfffffffffffffffd;
  do {
    uVar7 = uVar7 + 3;
    uVar8 = uVar7 >> 6;
    uVar10 = puVar1[uVar8];
    uVar9 = uVar10 | 1L << (uVar7 & 0x3f);
    src_1->cardinality = src_1->cardinality + (int)((uVar10 ^ uVar9) >> ((byte)uVar7 & 0x3f));
    puVar1[uVar8] = uVar9;
    uVar10 = puVar2[uVar8] | 1L << (uVar7 & 0x3f);
    bitset->cardinality =
         bitset->cardinality + (int)((puVar2[uVar8] ^ uVar10) >> ((byte)uVar7 & 0x3f));
    puVar2[uVar8] = uVar10;
  } while (uVar7 < 0xfffd);
  puVar1 = src_2->words;
  uVar7 = 0xffffffffffffffc2;
  do {
    uVar7 = uVar7 + 0x3e;
    uVar8 = uVar7 >> 6;
    uVar10 = puVar1[uVar8];
    uVar6 = (uint)uVar7 & 0x3e;
    uVar9 = uVar10 | 1L << uVar6;
    src_2->cardinality = src_2->cardinality + (int)((uVar10 ^ uVar9) >> (sbyte)uVar6);
    puVar1[uVar8] = uVar9;
    uVar10 = puVar2[uVar8];
    bitset->cardinality = bitset->cardinality - (uint)((uVar10 >> uVar6 & 1) != 0);
    puVar2[uVar8] = uVar10 & ~(1L << uVar6);
  } while (uVar7 < 0xffc2);
  iVar4 = bitset_container_compute_cardinality(bitset);
  bitset_container_andnot_nocard(src_1,src_2,dst);
  iVar5 = bitset_container_compute_cardinality(dst);
  _assert_int_equal((long)iVar4,(long)iVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x100);
  _Var3 = bitset_container_equals(bitset,dst);
  _assert_true((ulong)_Var3,"bitset_container_equals(BI, TMP)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x101);
  iVar5 = bitset_container_andnot(src_1,src_2,dst);
  _assert_int_equal((long)iVar4,(long)iVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x103);
  _Var3 = bitset_container_equals(bitset,dst);
  _assert_true((ulong)_Var3,"bitset_container_equals(BI, TMP)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x104);
  bitset_container_free(src_1);
  bitset_container_free(src_2);
  bitset_container_free(bitset);
  bitset_container_free(dst);
  return;
}

Assistant:

DEFINE_TEST(andnot_test) {
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BI = bitset_container_create();
    bitset_container_t* TMP = bitset_container_create();

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(TMP);

    for (size_t x = 0; x < (1 << 16); x += 3) {
        bitset_container_set(B1, x);
        bitset_container_set(BI, x);
    }

    // important: 62 is not divisible by 3
    for (size_t x = 0; x < (1 << 16); x += 62) {
        bitset_container_set(B2, x);
        bitset_container_remove(BI, x);
    }

    const int expected = bitset_container_compute_cardinality(BI);

    bitset_container_andnot_nocard(B1, B2, TMP);

    assert_int_equal(expected, bitset_container_compute_cardinality(TMP));
    assert_true(bitset_container_equals(BI, TMP));

    assert_int_equal(expected, bitset_container_andnot(B1, B2, TMP));
    assert_true(bitset_container_equals(BI, TMP));

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(BI);
    bitset_container_free(TMP);
}